

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_CallExprPrecedence_Test::TestBody(ExprWriterTest_CallExprPrecedence_Test *this)

{
  NumericExpr arg;
  StringRef name;
  bool bVar1;
  ExprBase file;
  ExprBase expected_expression;
  AssertHelper *this_00;
  Message *in_RDI;
  AssertionResult gtest_ar;
  Expr args [4];
  Function f;
  Reference x2;
  Reference x1;
  undefined4 in_stack_fffffffffffffdf8;
  Kind in_stack_fffffffffffffdfc;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  ExprBase in_stack_fffffffffffffe10;
  ExprBase other;
  ExprBase in_stack_fffffffffffffe18;
  int line;
  undefined8 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  pointer *ppBVar2;
  AssertHelper *this_01;
  CStringRef arg0;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *in_stack_fffffffffffffe58;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *args_00;
  ExprWriterTest *in_stack_fffffffffffffe60;
  ExprWriterTest *this_02;
  Function func;
  AssertHelper *this_03;
  Impl local_160 [10];
  Impl *local_138;
  Impl *local_130;
  BasicCStringRef<char> local_120;
  string local_118 [32];
  AssertionResult local_f8;
  Impl *local_e8;
  Impl *local_d8;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_d0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_c8;
  Impl *local_b8;
  BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38> local_a8;
  AssertHelper local_90 [5];
  Impl *local_68;
  BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41> local_60;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_50;
  Impl *local_20;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_18;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_10;
  
  func.impl_ = (Impl *)(in_RDI + 2);
  local_10.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
  local_18.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)in_stack_fffffffffffffe00,
             (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  name.size_._0_4_ = in_stack_fffffffffffffe28;
  name.data_ = (char *)in_stack_fffffffffffffe20;
  name.size_._4_4_ = in_stack_fffffffffffffe2c;
  local_68 = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::AddFunction
                               ((BasicExprFactory<std::allocator<char>_> *)
                                in_stack_fffffffffffffe18.impl_,name,
                                (int)((ulong)in_stack_fffffffffffffe10.impl_ >> 0x20),
                                (Type)in_stack_fffffffffffffe10.impl_);
  this_03 = local_90;
  local_20 = local_68;
  mp::MakeArrayRef<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (size_t)in_stack_fffffffffffffe00);
  local_60.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeCall(in_stack_fffffffffffffe60,func,in_stack_fffffffffffffe58);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::CallExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (CallExpr)in_stack_fffffffffffffe10.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  args_00 = &local_50;
  this_02 = (ExprWriterTest *)(in_RDI + 2);
  local_b8 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (Reference)in_stack_fffffffffffffe10.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  local_c8.super_ExprBase.impl_ =
       (ExprBase)
       ExprWriterTest::MakeConst
                 ((ExprWriterTest *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                  5.95510662704892e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (NumericConstant)in_stack_fffffffffffffe10.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  local_a8.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
                  (Kind)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                  (NumericExpr)in_stack_fffffffffffffe18.impl_,
                  (NumericExpr)in_stack_fffffffffffffe10.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )in_stack_fffffffffffffe10.impl_,(type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  arg0.data_ = (char *)&local_50.save_.
                        super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
  local_d0.super_ExprBase.impl_ =
       (ExprBase)
       ExprWriterTest::MakeConst
                 ((ExprWriterTest *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                  5.9558576068306e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (NumericConstant)in_stack_fffffffffffffe10.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  ppBVar2 = &local_50.save_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  this_01 = (AssertHelper *)(in_RDI + 2);
  local_e8 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (Reference)in_stack_fffffffffffffe10.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  arg.super_ExprBase.impl_._7_1_ = in_stack_fffffffffffffe0f;
  arg.super_ExprBase.impl_._0_7_ = in_stack_fffffffffffffe08;
  file.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeUnary
                                 (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,arg);
  local_d8 = file.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              )in_stack_fffffffffffffe10.impl_,(type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)0x1265a6);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_120,"{}");
  local_138 = local_20;
  other.impl_ = local_160;
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::ArrayRef<4ul>
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)
             in_stack_fffffffffffffe00,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> (*) [4])
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  expected_expression.impl_ = (Impl *)ExprWriterTest::MakeCall(this_02,func,args_00);
  local_130 = expected_expression.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::CallExpr>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),(CallExpr)other.impl_,
             (type)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)this_01);
  testing::internal::EqHelper<false>::Compare<char[33],std::__cxx11::string>
            ((char *)expected_expression.impl_,(char *)other.impl_,
             (char (*) [33])CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe00);
  line = (int)((ulong)expected_expression.impl_ >> 0x20);
  std::__cxx11::string::~string(local_118);
  mp::ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::~ArrayRef
            ((ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)0x126690);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x126759)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,(Type)((ulong)ppBVar2 >> 0x20),(char *)file.impl_,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=(this_03,in_RDI);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1267b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12680b);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CallExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeCall(f, mp::MakeArrayRef<mp::Expr>(0, 0)),
      MakeBinary(ex::ADD, x1, MakeConst(5)),
      MakeConst(7),
      MakeUnary(ex::FLOOR, x2)
  };
  CHECK_WRITE("foo(foo(), x1 + 5, 7, floor(x2))", MakeCall(f, args));
}